

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdGetLastErrorCode(void *handle)

{
  CfdCapiManager *in_RSI;
  CfdException last_error;
  CfdException CStack_38;
  
  cfd::capi::CfdCapiManager::GetLastError(&CStack_38,in_RSI,handle);
  cfd::core::CfdException::~CfdException(&CStack_38);
  return CStack_38.error_code_;
}

Assistant:

int CfdGetLastErrorCode(void* handle) {
  try {
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    return last_error.GetErrorCode();
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}